

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O2

void __thiscall
Qentem::StringStream<char16_t>::StringStream
          (StringStream<char16_t> *this,StringStream<char16_t> *stream)

{
  size_t in_RCX;
  
  this->storage_ = (char16_t *)0x0;
  this->length_ = 0;
  this->capacity_ = 0;
  if (stream->length_ != 0) {
    allocate(this,stream->length_);
    write(this,(int)stream->storage_,(void *)(ulong)stream->length_,in_RCX);
    return;
  }
  return;
}

Assistant:

StringStream(const StringStream &stream) {
        if (stream.Length() != 0) {
            allocate(stream.Length());
            write(stream.First(), stream.Length());
        }
    }